

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O0

void __thiscall HydEngine::advance(HydEngine *this,int *tstep)

{
  int iVar1;
  long lVar2;
  int local_1c;
  int timeLeft;
  int *tstep_local;
  HydEngine *this_local;
  
  *tstep = 0;
  if (this->engineState == INITIALIZED) {
    this->hydStep = 0;
    lVar2 = Network::option(this->network,TOTAL_DURATION);
    local_1c = (int)lVar2 - this->currentTime;
    if ((this->halted & 1U) != 0) {
      local_1c = 0;
    }
    if (0 < local_1c) {
      iVar1 = getTimeStep(this);
      this->hydStep = iVar1;
      if (local_1c < this->hydStep) {
        this->hydStep = local_1c;
      }
    }
    *tstep = this->hydStep;
    updateEnergyUsage(this);
    updateTanks(this);
    this->currentTime = this->hydStep + this->currentTime;
    if (this->rptTime <= this->currentTime) {
      lVar2 = Network::option(this->network,REPORT_STEP);
      this->rptTime = this->rptTime + (int)lVar2;
    }
    updatePatterns(this);
  }
  return;
}

Assistant:

void HydEngine::advance(int* tstep)
{
    *tstep = 0;
    if ( engineState != HydEngine::INITIALIZED ) return;

    // ... save current results to hydraulics file
    //if ( saveToFile ) errcode = hydWriter.writeResults(hydState, hydTime);

    // ... if time remains, find time (hydStep) until next hydraulic event

    hydStep = 0;
    int timeLeft = network->option(Options::TOTAL_DURATION) - currentTime;
    if ( halted ) timeLeft = 0;
    if ( timeLeft > 0  )
    {
        hydStep = getTimeStep();
        if ( hydStep > timeLeft ) hydStep = timeLeft;
    }
    *tstep = hydStep;

    // ... update energy usage and tank levels over the time step

    updateEnergyUsage();
    updateTanks();

    // ... advance time counters

    currentTime += hydStep;
    if ( currentTime >= rptTime )
    {
        rptTime += network->option(Options::REPORT_STEP);
    }

    // ... advance time patterns

    updatePatterns();
}